

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O0

void test_bson_utf8_invalid(void)

{
  byte bVar1;
  long lVar2;
  
  bVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,1);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x4f,"test_bson_utf8_invalid","!bson_utf8_validate ((const char *) bad, 1, true)");
    abort();
  }
  bVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x50,"test_bson_utf8_invalid","!bson_utf8_validate ((const char *) bad, 1, false)");
    abort();
  }
  lVar2 = bson_utf8_escape_for_json(test_bson_utf8_invalid::bad,1);
  if (lVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x51,"test_bson_utf8_invalid","!bson_utf8_escape_for_json ((const char *) bad, 1)");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_utf8_invalid (void)
{
   /* no UTF-8 sequence can start with 0x80 */
   static const unsigned char bad[] = {0x80, 0};

   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, false));
   BSON_ASSERT (!bson_utf8_escape_for_json ((const char *) bad, 1));
}